

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_vocab.c
# Opt level: O0

uint32_t HashVocab_id(HashVocab vocab,char *word)

{
  uint64_t key;
  byte local_31;
  ProbingVocabularyEntry_T *pPStack_30;
  uint8_t check_dead_loop;
  ProbingVocabularyEntry_T *slot;
  uint64_t hashed;
  char *word_local;
  HashVocab vocab_local;
  
  key = hash(word);
  pPStack_30 = HashTable_ideal(&vocab->tb,key);
  local_31 = 0;
  while( true ) {
    if (pPStack_30->key == kInvalidHash) {
      return 0xffffffff;
    }
    if (pPStack_30->key == key) break;
    pPStack_30 = pPStack_30 + 1;
    if (pPStack_30 == (vocab->tb).end_) {
      local_31 = local_31 + 1;
      if (1 < local_31) {
        return 0xffffffff;
      }
      pPStack_30 = (vocab->tb).begin_;
    }
  }
  return pPStack_30->value;
}

Assistant:

uint32_t HashVocab_id(const HashVocab vocab, const char* word){
    uint64_t hashed = hash(word);
    //if (hashed == kUnknownHash || hashed == kUnknownCapHash) {
    //    return 0;
    //}
    ProbingVocabularyEntry_T *slot = HashTable_ideal(&vocab->tb, hashed);
    uint8_t check_dead_loop = 0;
    while (1) {
        if (slot->key == kInvalidHash) {
            //printf("hash:%zu\n", hashed);
            //printf("cannot find\n");
            return -1;//cannot find
        }
        if (slot->key == hashed) {
            return slot->value;
        }
        if ((++slot) == vocab->tb.end_) {
            check_dead_loop++;
            if (check_dead_loop >= 2) {
                //printf("hash:%zu\n", hashed);
                //printf("cannot find dead loop\n");
                return -1;
            }
            slot = vocab->tb.begin_;
        }
    }
    return -1;
}